

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O2

void __thiscall
dynet::SimpleSGDTrainer::update_lookup_params
          (SimpleSGDTrainer *this,real scale,real gscale,size_t idx,size_t lidx)

{
  LookupParameterStorage *pLVar1;
  initializer_list<dynet::Tensor_*> __l;
  allocator_type local_41;
  real local_40;
  real local_3c;
  _Vector_base<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> local_38;
  Tensor *local_20;
  long local_18;
  
  pLVar1 = (((this->super_Trainer).model)->lookup_params).
           super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
           ._M_impl.super__Vector_impl_data._M_start[idx];
  local_20 = (Tensor *)
             (*(long *)&(pLVar1->values).
                        super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
                        super__Vector_impl_data + lidx * 0x58);
  local_18 = lidx * 0x58 +
             *(long *)&(pLVar1->grads).
                       super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
                       super__Vector_impl_data;
  __l._M_len = 2;
  __l._M_array = &local_20;
  local_40 = scale;
  local_3c = gscale;
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::vector
            ((vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *)&local_38,__l,&local_41);
  (*(this->super_Trainer)._vptr_Trainer[3])
            ((ulong)(uint)local_40,(ulong)(uint)local_3c,this,&local_38);
  std::_Vector_base<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void SimpleSGDTrainer::update_lookup_params(real scale, real gscale, size_t idx, size_t lidx) {
  auto & p = model->lookup_parameters_list()[idx];
  update_rule(scale, gscale, {&p->values[lidx], &p->grads[lidx]});
}